

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void wasm::SimplifyLocals<true,_true,_true>::doNoteNonLinear
               (SimplifyLocals<true,_true,_true> *self,Expression **currp)

{
  bool bVar1;
  mapped_type *this;
  If *pIVar2;
  reference pNVar3;
  pair<std::_Rb_tree_const_iterator<wasm::Name>,_bool> pVar4;
  undefined1 auStack_d8 [8];
  Name target;
  iterator __end5;
  iterator __begin5;
  NameSet *__range5;
  NameSet targets;
  value_type local_70;
  _Base_ptr local_38;
  undefined1 local_30;
  Break *local_28;
  Break *br;
  Expression *curr;
  Expression **currp_local;
  SimplifyLocals<true,_true,_true> *self_local;
  
  br = (Break *)*currp;
  curr = (Expression *)currp;
  currp_local = (Expression **)self;
  local_28 = Expression::dynCast<wasm::Break>((Expression *)br);
  if (local_28 == (Break *)0x0) {
    bVar1 = Expression::is<wasm::Block>((Expression *)br);
    if (bVar1) {
      return;
    }
    bVar1 = Expression::is<wasm::If>((Expression *)br);
    if (bVar1) {
      pIVar2 = Expression::cast<wasm::If>((Expression *)br);
      if (pIVar2->ifFalse != (Expression *)0x0) {
        __assert_fail("!curr->cast<If>() ->ifFalse",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x91,
                      "static void wasm::SimplifyLocals<>::doNoteNonLinear(SimplifyLocals<allowTee, allowStructure, allowNesting> *, Expression **) [allowTee = true, allowStructure = true, allowNesting = true]"
                     );
      }
    }
    else {
      BranchUtils::getUniqueTargets((NameSet *)&__range5,(Expression *)br);
      __end5 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                         ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                          &__range5);
      target.super_IString.str._M_str =
           (char *)std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                             ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *
                              )&__range5);
      while (bVar1 = std::operator!=(&__end5,(_Self *)&target.super_IString.str._M_str), bVar1) {
        pNVar3 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end5);
        auStack_d8 = (undefined1  [8])(pNVar3->super_IString).str._M_len;
        target.super_IString.str._M_len = (size_t)(pNVar3->super_IString).str._M_str;
        std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
                  ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                   (currp_local + 0x33),(value_type *)auStack_d8);
        std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end5);
      }
      std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
                ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range5);
    }
  }
  else if (local_28->value == (Expression *)0x0) {
    this = std::
           map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
           ::operator[]((map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
                         *)(currp_local + 0x2d),&local_28->name);
    local_70.brp = (Expression **)curr;
    std::
    map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
    ::map(&local_70.sinkables,
          (map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
           *)(currp_local + 0x27));
    std::
    vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
    ::push_back(this,&local_70);
    BlockBreak::~BlockBreak(&local_70);
  }
  else {
    pVar4 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
                      ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                       (currp_local + 0x33),&local_28->name);
    local_38 = (_Base_ptr)pVar4.first._M_node;
    local_30 = pVar4.second;
  }
  std::
  map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
  ::clear((map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
           *)(currp_local + 0x27));
  return;
}

Assistant:

static void
  doNoteNonLinear(SimplifyLocals<allowTee, allowStructure, allowNesting>* self,
                  Expression** currp) {
    // Main processing.
    auto* curr = *currp;
    if (auto* br = curr->dynCast<Break>()) {
      if (br->value) {
        // value means the block already has a return value
        self->unoptimizableBlocks.insert(br->name);
      } else {
        self->blockBreaks[br->name].push_back(
          {currp, std::move(self->sinkables)});
      }
    } else if (curr->is<Block>()) {
      return; // handled in visitBlock
    } else if (curr->is<If>()) {
      assert(!curr->cast<If>()
                ->ifFalse); // if-elses are handled by doNoteIf* methods
    } else {
      // Not one of the recognized instructions, so do not optimize here: mark
      // all the targets as unoptimizable.
      // TODO optimize BrOn, Switch, etc.
      auto targets = BranchUtils::getUniqueTargets(curr);
      for (auto target : targets) {
        self->unoptimizableBlocks.insert(target);
      }
      // TODO: we could use this info to stop gathering data on these blocks
    }
    self->sinkables.clear();
  }